

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O0

char * ngx_conf_merge_path_value
                 (ngx_conf_t *cf,ngx_path_t **path,ngx_path_t *prev,ngx_path_init_t *init)

{
  ngx_path_t *pnVar1;
  ngx_int_t nVar2;
  ulong local_38;
  ngx_uint_t i;
  ngx_path_init_t *init_local;
  ngx_path_t *prev_local;
  ngx_path_t **path_local;
  ngx_conf_t *cf_local;
  
  if (*path == (ngx_path_t *)0x0) {
    if (prev == (ngx_path_t *)0x0) {
      pnVar1 = (ngx_path_t *)ngx_pcalloc(cf->pool,0x60);
      *path = pnVar1;
      if (*path == (ngx_path_t *)0x0) {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
      else {
        pnVar1 = *path;
        (pnVar1->name).len = (init->name).len;
        (pnVar1->name).data = (init->name).data;
        nVar2 = ngx_conf_full_name(cf->cycle,&(*path)->name,0);
        if (nVar2 == 0) {
          for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
            (*path)->level[local_38] = init->level[local_38];
            (*path)->len = init->level[local_38] + (long)(int)(uint)(init->level[local_38] != 0) +
                           (*path)->len;
          }
          nVar2 = ngx_add_path(cf,path);
          if (nVar2 == 0) {
            cf_local = (ngx_conf_t *)0x0;
          }
          else {
            cf_local = (ngx_conf_t *)0xffffffffffffffff;
          }
        }
        else {
          cf_local = (ngx_conf_t *)0xffffffffffffffff;
        }
      }
    }
    else {
      *path = prev;
      cf_local = (ngx_conf_t *)0x0;
    }
  }
  else {
    cf_local = (ngx_conf_t *)0x0;
  }
  return (char *)cf_local;
}

Assistant:

char *
ngx_conf_merge_path_value(ngx_conf_t *cf, ngx_path_t **path, ngx_path_t *prev,
    ngx_path_init_t *init)
{
    ngx_uint_t  i;

    if (*path) {
        return NGX_CONF_OK;
    }

    if (prev) {
        *path = prev;
        return NGX_CONF_OK;
    }

    *path = ngx_pcalloc(cf->pool, sizeof(ngx_path_t));
    if (*path == NULL) {
        return NGX_CONF_ERROR;
    }

    (*path)->name = init->name;

    if (ngx_conf_full_name(cf->cycle, &(*path)->name, 0) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    for (i = 0; i < NGX_MAX_PATH_LEVEL; i++) {
        (*path)->level[i] = init->level[i];
        (*path)->len += init->level[i] + (init->level[i] ? 1 : 0);
    }

    if (ngx_add_path(cf, path) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}